

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InvertDatabase.cc
# Opt level: O0

void __thiscall
InvertDatabase::print_idlist
          (InvertDatabase *this,ostream *idlstrm,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *ival,int supsz)

{
  element_type *this_00;
  int *piVar1;
  ostream *poVar2;
  int *ival_data;
  int cnt;
  int cid;
  int i;
  int supsz_local;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> *ival_local;
  ostream *idlstrm_local;
  InvertDatabase *this_local;
  
  this_00 = std::
            __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)ival);
  piVar1 = std::vector<int,_std::allocator<int>_>::data(this_00);
  if (0 < supsz) {
    ival_data._4_4_ = *piVar1;
    ival_data._0_4_ = 0;
    cnt = 0;
    while (cnt < supsz) {
      if (ival_data._4_4_ == piVar1[cnt]) {
        ival_data._0_4_ = (int)ival_data + 1;
        cnt = cnt + 2;
      }
      else {
        poVar2 = (ostream *)std::ostream::operator<<(idlstrm,ival_data._4_4_);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)ival_data);
        std::operator<<(poVar2," ");
        ival_data._4_4_ = piVar1[cnt];
        ival_data._0_4_ = 0;
      }
    }
    poVar2 = (ostream *)std::ostream::operator<<(idlstrm,ival_data._4_4_);
    poVar2 = std::operator<<(poVar2," ");
    std::ostream::operator<<(poVar2,(int)ival_data);
  }
  return;
}

Assistant:

void InvertDatabase::print_idlist(ostream& idlstrm, shared_ptr<vint> ival, int supsz) {
    int i, cid, cnt;
    int *ival_data = ival->data();

    if (supsz > 0) {
        cid = ival_data[0];
        cnt = 0;
        for (i = 0; i < supsz;) {
            if (cid == ival_data[i]) {
                cnt++;
                i += 2;
            } else {
                idlstrm << cid << " " << cnt << " ";
                cid = ival_data[i];
                cnt = 0;
            }
        }
        idlstrm << cid << " " << cnt;
    }
}